

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

ColorRole __thiscall QWidget::backgroundRole(QWidget *this)

{
  byte bVar1;
  uint uVar2;
  
  do {
    bVar1 = *(byte *)(*(long *)&this->field_0x8 + 0x251);
    if (bVar1 != 0x11) {
      return (uint)bVar1;
    }
    uVar2 = (this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i;
  } while ((((uVar2 & 1) == 0) && ((uVar2 & 0xff) != 0x12)) &&
          (this = *(QWidget **)(*(long *)&this->field_0x8 + 0x10), this != (QWidget *)0x0));
  return Window;
}

Assistant:

QPalette::ColorRole QWidget::backgroundRole() const
{

    const QWidget *w = this;
    do {
        QPalette::ColorRole role = w->d_func()->bg_role;
        if (role != QPalette::NoRole)
            return role;
        if (w->isWindow() || w->windowType() == Qt::SubWindow)
            break;
        w = w->parentWidget();
    } while (w);
    return QPalette::Window;
}